

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall google::protobuf::DescriptorPool::DescriptorPool(DescriptorPool *this)

{
  _Rb_tree_header *p_Var1;
  Tables *this_00;
  
  this->default_error_collector_ = (ErrorCollector *)0x0;
  this->underlay_ = (DescriptorPool *)0x0;
  this->mutex_ = (Mutex *)0x0;
  this->fallback_database_ = (DescriptorDatabase *)0x0;
  this_00 = (Tables *)operator_new(0x238);
  Tables::Tables(this_00);
  (this->tables_).ptr_ = this_00;
  this->enforce_dependencies_ = true;
  this->lazily_build_dependencies_ = false;
  this->allow_unknown_ = false;
  this->enforce_weak_ = false;
  p_Var1 = &(this->unused_import_track_files_)._M_t._M_impl.super__Rb_tree_header;
  (this->unused_import_track_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->unused_import_track_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->unused_import_track_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->unused_import_track_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->unused_import_track_files_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->disallow_enforce_utf8_ = false;
  return;
}

Assistant:

DescriptorPool::DescriptorPool()
  : mutex_(NULL),
    fallback_database_(NULL),
    default_error_collector_(NULL),
    underlay_(NULL),
    tables_(new Tables),
    enforce_dependencies_(true),
    lazily_build_dependencies_(false),
    allow_unknown_(false),
    enforce_weak_(false),
    disallow_enforce_utf8_(false) {}